

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# konvert.h
# Opt level: O0

double konvert::atof(char *__nptr)

{
  long lVar1;
  int iVar2;
  double dVar3;
  undefined4 uVar4;
  undefined4 uVar13;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint32_t *input_ptr;
  double sign;
  unsigned_long frac_res;
  unsigned_long int_res;
  double frac;
  uint32_t *buf_ptr;
  uchar rbuf [4];
  int *local_48;
  long local_38;
  ulong local_30;
  double local_28;
  byte local_14;
  byte bStack_13;
  byte bStack_12;
  byte bStack_11;
  int *local_10;
  
  local_28 = 1.0;
  local_10 = (int *)__nptr;
  if (*__nptr == '-') {
    local_28 = -1.0;
    local_10 = (int *)(__nptr + 1);
  }
  dVar3 = local_28;
  local_38 = 0;
  local_48 = (int *)((long)local_10 + 1);
  local_30 = (ulong)((char)*local_10 + -0x30);
  if (local_30 < 10) {
    while( true ) {
      local_10 = local_48 + 1;
      iVar2 = *local_48 + -0x30303030;
      bStack_11 = (byte)((uint)iVar2 >> 0x18);
      bStack_12 = (byte)((uint)iVar2 >> 0x10);
      bStack_13 = (byte)((uint)iVar2 >> 8);
      local_14 = (byte)iVar2;
      if (9 < local_14) break;
      local_30 = local_30 * 10 + (ulong)local_14;
      if (9 < bStack_13) {
        if (bStack_13 != 0xfe) {
          auVar6._8_4_ = (int)(local_30 >> 0x20);
          auVar6._0_8_ = local_30;
          auVar6._12_4_ = 0x45300000;
          return local_28 *
                 ((auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_30) - 4503599627370496.0));
        }
        local_10 = (int *)((long)local_48 + 2);
        goto LAB_00101b23;
      }
      local_30 = local_30 * 10 + (ulong)bStack_13;
      if (9 < bStack_12) {
        if (bStack_12 != 0xfe) {
          auVar7._8_4_ = (int)(local_30 >> 0x20);
          auVar7._0_8_ = local_30;
          auVar7._12_4_ = 0x45300000;
          return local_28 *
                 ((auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_30) - 4503599627370496.0));
        }
        local_10 = (int *)((long)local_48 + 3);
        goto LAB_00101b23;
      }
      local_30 = local_30 * 10 + (ulong)bStack_12;
      if (9 < bStack_11) {
        if (bStack_11 != 0xfe) {
          auVar8._8_4_ = (int)(local_30 >> 0x20);
          auVar8._0_8_ = local_30;
          auVar8._12_4_ = 0x45300000;
          return local_28 *
                 ((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_30) - 4503599627370496.0));
        }
        goto LAB_00101b23;
      }
      local_30 = local_30 * 10 + (ulong)bStack_11;
      local_48 = local_10;
    }
    if (local_14 != 0xfe) {
      auVar5._8_4_ = (int)(local_30 >> 0x20);
      auVar5._0_8_ = local_30;
      auVar5._12_4_ = 0x45300000;
      return local_28 *
             ((auVar5._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_30) - 4503599627370496.0));
    }
    local_10 = (int *)((long)local_48 + 1);
  }
  else {
    if (local_30 != 0xfffffffffffffffe) {
      dVar3 = nan("nan");
      return dVar3;
    }
    local_10 = (int *)((long)local_10 + 1);
    local_30 = 0;
  }
LAB_00101b23:
  local_48 = local_10;
  while( true ) {
    iVar2 = *local_48 + -0x30303030;
    bStack_11 = (byte)((uint)iVar2 >> 0x18);
    bStack_12 = (byte)((uint)iVar2 >> 0x10);
    bStack_13 = (byte)((uint)iVar2 >> 8);
    local_14 = (byte)iVar2;
    uVar4 = (undefined4)local_30;
    uVar13 = (undefined4)(local_30 >> 0x20);
    if (9 < local_14) {
      auVar14._8_4_ = (int)((ulong)local_38 >> 0x20);
      auVar14._0_8_ = local_38;
      auVar14._12_4_ = 0x45300000;
      auVar9._8_4_ = uVar13;
      auVar9._0_8_ = local_30;
      auVar9._12_4_ = 0x45300000;
      return local_28 *
             ((auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_38) - 4503599627370496.0)) +
             ((auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar4) - 4503599627370496.0)) * dVar3;
    }
    lVar1 = local_38 * 10 + (ulong)local_14;
    if (9 < bStack_13) {
      auVar15._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar15._0_8_ = lVar1;
      auVar15._12_4_ = 0x45300000;
      auVar10._8_4_ = uVar13;
      auVar10._0_8_ = local_30;
      auVar10._12_4_ = 0x45300000;
      return local_28 * 0.1 *
             ((auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) +
             ((auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar4) - 4503599627370496.0)) * dVar3;
    }
    lVar1 = lVar1 * 10 + (ulong)bStack_13;
    if (9 < bStack_12) {
      auVar16._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar16._0_8_ = lVar1;
      auVar16._12_4_ = 0x45300000;
      auVar11._8_4_ = uVar13;
      auVar11._0_8_ = local_30;
      auVar11._12_4_ = 0x45300000;
      return local_28 * 0.01 *
             ((auVar16._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) +
             ((auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar4) - 4503599627370496.0)) * dVar3;
    }
    lVar1 = lVar1 * 10 + (ulong)bStack_12;
    if (9 < bStack_11) break;
    local_38 = lVar1 * 10 + (ulong)bStack_11;
    local_28 = local_28 * 0.0001;
    local_48 = local_48 + 1;
  }
  auVar17._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar17._0_8_ = lVar1;
  auVar17._12_4_ = 0x45300000;
  auVar12._8_4_ = uVar13;
  auVar12._0_8_ = local_30;
  auVar12._12_4_ = 0x45300000;
  return local_28 * 0.001 *
         ((auVar17._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) +
         ((auVar12._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,uVar4) - 4503599627370496.0)) * dVar3;
}

Assistant:

inline double atof(const char *input){
    unsigned char rbuf[4];
    uint32_t *buf_ptr = (uint32_t *)rbuf;

    double frac = 1.0;
    if(*input == '-'){ frac = -1.0; input++; }

    unsigned long int_res = 0;
    unsigned long frac_res = 0;

    double sign = frac;
    uint32_t *input_ptr = (uint32_t *)(input + 1);

    if((int_res = (*input - '0')) <= 9) {
      while(true) {
        *buf_ptr = *input_ptr++ - 0x30303030;

        if( rbuf[0] <= 9 ) int_res = int_res*10 + rbuf[0];
        else if(rbuf[0] == 254) {input = ((char *)input_ptr - 3); break;}
        else return frac * int_res;

        if( rbuf[1] <= 9 ) int_res = int_res*10 + rbuf[1];
        else if(rbuf[1] == 254) {input = ((char *)input_ptr - 2); break;}
        else return frac * int_res;

        if( rbuf[2] <= 9 ) int_res = int_res*10 + rbuf[2];
        else if(rbuf[2] == 254) {input = ((char *)input_ptr - 1); break;}
        else return frac * int_res;

        if( rbuf[3] <= 9 ) int_res = int_res*10 + rbuf[3];
        else if(rbuf[3] == 254) {input = ((char *)input_ptr - 0); break;}
        else return frac * int_res;
      }
    }
    else if(int_res == (unsigned long)-2){ input++; int_res = 0; }
    else return nan("nan");


    input_ptr = (uint32_t *)(input);
    while(true){
      *buf_ptr = *input_ptr++ - 0x30303030;
      if( rbuf[0] <= 9 ) frac_res = frac_res*10 + rbuf[0]; else return (frac     * frac_res + int_res * sign);
      if( rbuf[1] <= 9 ) frac_res = frac_res*10 + rbuf[1]; else return (frac * .1 * frac_res + int_res * sign);
      if( rbuf[2] <= 9 ) frac_res = frac_res*10 + rbuf[2]; else return (frac * .01 * frac_res + int_res * sign);
      if( rbuf[3] <= 9 ) frac_res = frac_res*10 + rbuf[3]; else return (frac * .001 * frac_res + int_res * sign);
      frac *= .0001;
    }
  }